

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

void __thiscall
helics::FilterFederate::processMessageFilter(FilterFederate *this,ActionMessage *cmd)

{
  undefined4 uVar1;
  tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_> tVar2;
  long *plVar3;
  _Head_base<0UL,_helics::Message_*,_false> _Var4;
  undefined4 uVar6;
  pointer pcVar5;
  pointer __n;
  key_type kVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  const_iterator cVar11;
  pointer *__ptr;
  pointer *ppuVar12;
  action_t aVar13;
  bool bVar14;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  key_type local_148;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_140;
  uint16_t local_132;
  key_type local_130;
  key_type local_128;
  key_type local_120;
  Message *local_118;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_110;
  uint32_t local_ec;
  ActionMessage local_e8;
  
  if ((cmd->dest_id).gid != (this->mFedID).gid) {
    if ((this->mSendMessage).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->mSendMessage)._M_invoker)((_Any_data *)&this->mSendMessage,cmd);
      return;
    }
    goto LAB_0030b7ea;
  }
  local_e8.messageAction = (cmd->dest_id).gid;
  local_e8.messageID = (cmd->dest_handle).hid;
  cVar11 = std::
           _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->filters).lookup._M_h,(key_type *)&local_e8);
  if (cVar11.super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    return;
  }
  tVar2.super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
  super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_> *)
        &(this->filters).dataStorage.
         super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start
         [*(long *)((long)cVar11.
                          super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                          ._M_cur + 0x10)]._M_t.
         super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>;
  if (tVar2.super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
      super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl ==
      (_Head_base<0UL,_helics::FilterInfo_*,_false>)0x0) {
    return;
  }
  (this->mCoord).triggered = true;
  if (((*(byte *)((long)tVar2.
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x9b) &
       0x10) == 0) &&
     (plVar3 = *(long **)((long)tVar2.
                                super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                                .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl +
                         0xa0), plVar3 != (long *)0x0)) {
    if (*(char *)((long)tVar2.
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x99) ==
        '\x01') {
      createMessageFromCommand((helics *)&local_118,cmd);
      (**(code **)(*plVar3 + 0x18))(&local_110,plVar3,(helics *)&local_118);
      if (local_118 != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_118,local_118);
      }
      local_118 = (Message *)0x0;
      if (local_110.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_110.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppuVar12 = (pointer *)
                   local_110.
                   super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          _Var4._M_head_impl = (Message *)*ppuVar12;
          if ((_Head_base<0UL,_helics::Message_*,_false>)_Var4._M_head_impl !=
              (_Head_base<0UL,_helics::Message_*,_false>)0x0) {
            *ppuVar12 = (pointer)0x0;
            local_140._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
                 (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
                 (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)_Var4._M_head_impl
            ;
            ActionMessage::ActionMessage
                      (&local_e8,
                       (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_140);
            ActionMessage::operator=(cmd,&local_e8);
            ActionMessage::~ActionMessage(&local_e8);
            if (local_140._M_t.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>)0x0) {
              CLI::std::default_delete<helics::Message>::operator()
                        ((default_delete<helics::Message> *)&local_140,
                         (Message *)
                         local_140._M_t.
                         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                         .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
            }
            local_140._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
                 (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
                 (_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>)0x0;
            if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->mDeliverMessage)._M_invoker)((_Any_data *)&this->mDeliverMessage,cmd);
          }
          ppuVar12 = ppuVar12 + 1;
        } while ((pointer)ppuVar12 !=
                 local_110.
                 super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::~vector(&local_110);
      return;
    }
    aVar13 = cmd->messageAction;
    uVar1 = cmd->source_id;
    uVar6 = cmd->source_handle;
    local_132 = cmd->counter;
    local_ec = cmd->sequenceID;
    createMessageFromCommand((helics *)&local_148,cmd);
    local_110.
    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&local_110.
                   super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar5 = (((string *)((long)local_148 + 0x70))->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar5,pcVar5 + *(size_type *)((long)local_148 + 0x78));
    local_120 = local_148;
    local_148.fed_id.gid = 0;
    local_148.handle.hid = 0;
    (**(code **)(**(long **)((long)tVar2.
                                   super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                                   .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl
                            + 0xa0) + 0x10))((key_type *)&local_e8);
    uVar8 = local_e8._0_8_;
    kVar7 = local_148;
    local_e8.messageAction = 0;
    local_e8.messageID = 0;
    uVar9 = local_e8._0_8_;
    local_e8.messageAction = (action_t)uVar8;
    local_e8.messageID = SUB84(uVar8,4);
    local_148.fed_id.gid = local_e8.messageAction;
    local_148.handle.hid = local_e8.messageID;
    if ((kVar7 != (key_type)0x0) &&
       (local_e8._0_8_ = uVar9,
       CLI::std::default_delete<helics::Message>::operator()
                 ((default_delete<helics::Message> *)&local_148,(Message *)kVar7),
       (key_type)local_e8._0_8_ != (key_type)0x0)) {
      CLI::std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_e8,(Message *)local_e8._0_8_);
    }
    local_e8.messageAction = 0;
    local_e8.messageID = 0;
    if (local_120 != (key_type)0x0) {
      CLI::std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_120,(Message *)local_120);
    }
    kVar7 = local_148;
    local_120.fed_id.gid = 0;
    local_120.handle.hid = 0;
    if (local_148 == (key_type)0x0) {
      ActionMessage::ActionMessage(&local_e8,cmd_ignore);
LAB_0030b6a0:
      ActionMessage::operator=(cmd,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
    }
    else {
      __n = *(pointer *)((long)local_148 + 0x78);
      if (__n == local_110.
                 super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
        if (__n != (pointer)0x0) {
          iVar10 = bcmp((((string *)((long)local_148 + 0x70))->_M_dataplus)._M_p,
                        local_110.
                        super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
          bVar14 = iVar10 == 0;
          goto LAB_0030b605;
        }
      }
      else {
        bVar14 = false;
LAB_0030b605:
        if ((aVar13 == cmd_send_for_dest_filter_return) && (!bVar14)) {
          local_128 = kVar7;
          local_148.fed_id.gid = 0;
          local_148.handle.hid = 0;
          ActionMessage::ActionMessage
                    (&local_e8,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     &local_128);
          ActionMessage::operator=(cmd,&local_e8);
          ActionMessage::~ActionMessage(&local_e8);
          if (local_128 != (key_type)0x0) {
            CLI::std::default_delete<helics::Message>::operator()
                      ((default_delete<helics::Message> *)&local_128,(Message *)local_128);
          }
          local_128.fed_id.gid = 0;
          local_128.handle.hid = 0;
          cmd->dest_id = 0;
          cmd->dest_handle = -1700000000;
          if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->mDeliverMessage)._M_invoker)((_Any_data *)&this->mDeliverMessage,cmd);
          ActionMessage::ActionMessage(&local_e8,cmd_ignore);
          goto LAB_0030b6a0;
        }
      }
      local_130 = kVar7;
      local_148.fed_id.gid = 0;
      local_148.handle.hid = 0;
      ActionMessage::ActionMessage
                (&local_e8,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_130);
      ActionMessage::operator=(cmd,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
      if (local_130 != (key_type)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_130,(Message *)local_130);
      }
      local_130.fed_id.gid = 0;
      local_130.handle.hid = 0;
    }
    if (local_110.
        super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_110.
                  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_110.
                      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_110.
                                       super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                     super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                     .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl +
                             1));
    }
    if (local_148 != (key_type)0x0) {
      CLI::std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_148,(Message *)local_148);
    }
    if ((aVar13 == cmd_send_for_dest_filter_return) || (aVar13 == cmd_send_for_filter_return)) {
      (cmd->dest_id).gid = uVar1;
      (cmd->dest_handle).hid = uVar6;
      cmd->counter = local_132;
      cmd->sequenceID = local_ec;
      (cmd->source_handle).hid =
           *(BaseType *)
            ((long)tVar2.
                   super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                   .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 4);
      (cmd->source_id).gid = (this->mFedID).gid;
      if (cmd->messageAction == cmd_ignore) {
        aVar13 = (uint)(aVar13 == cmd_send_for_dest_filter_return) * 4 + cmd_null_message;
      }
      else {
        aVar13 = (uint)(aVar13 != cmd_send_for_dest_filter_return) ^ cmd_dest_filter_result;
      }
      ActionMessage::setAction(cmd,aVar13);
    }
    else {
      if (cmd->messageAction == cmd_ignore) {
        return;
      }
      (cmd->source_id).gid = uVar1;
      (cmd->source_handle).hid = uVar6;
LAB_0030b4e1:
      cmd->dest_id = 0;
      cmd->dest_handle = -1700000000;
    }
  }
  else {
    aVar13 = cmd->messageAction;
    if ((aVar13 != cmd_send_for_dest_filter_return) && (aVar13 != cmd_send_for_filter_return)) {
      ActionMessage::setAction(cmd,cmd_send_message);
      goto LAB_0030b4e1;
    }
    cmd->dest_id = (GlobalFederateId)(cmd->source_id).gid;
    cmd->dest_handle = (InterfaceHandle)(cmd->source_handle).hid;
    ActionMessage::setAction
              (cmd,(uint)(aVar13 == cmd_send_for_dest_filter_return) | cmd_filter_result);
    (cmd->source_handle).hid =
         *(BaseType *)
          ((long)tVar2.
                 super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                 .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 4);
    (cmd->source_id).gid = (this->mFedID).gid;
  }
  if ((this->mDeliverMessage).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mDeliverMessage)._M_invoker)((_Any_data *)&this->mDeliverMessage,cmd);
    return;
  }
LAB_0030b7ea:
  std::__throw_bad_function_call();
}

Assistant:

void FilterFederate::processMessageFilter(ActionMessage& cmd)
{
    if (cmd.dest_id != mFedID) {
        mSendMessage(cmd);
    } else {
        // deal with local source filters
        auto* FiltI = getFilterInfo(cmd.getDest());
        if (FiltI != nullptr) {
            mCoord.triggered = true;
            if ((!checkActionFlag(*FiltI, disconnected_flag)) && (FiltI->filterOp)) {
                if (FiltI->cloning) {
                    auto new_messages =
                        FiltI->filterOp->processVector(createMessageFromCommand(std::move(cmd)));
                    for (auto& msg : new_messages) {
                        if (msg) {
                            cmd = ActionMessage(std::move(msg));
                            mDeliverMessage(cmd);
                        }
                    }
                } else {
                    bool destFilter = (cmd.action() == CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                    bool returnToSender =
                        ((cmd.action() == CMD_SEND_FOR_FILTER_AND_RETURN) || destFilter);
                    auto source = cmd.getSource();
                    auto filterCounter = cmd.counter;
                    auto seqID = cmd.sequenceID;
                    if (FiltI->filterOp) {
                        auto tempMessage = createMessageFromCommand(std::move(cmd));
                        auto dest = tempMessage->dest;
                        tempMessage = FiltI->filterOp->process(std::move(tempMessage));

                        if (tempMessage) {
                            if (tempMessage->dest != dest && destFilter) {
                                // the destination was altered we need to start the process over
                                cmd = ActionMessage(std::move(tempMessage));
                                cmd.dest_id = parent_broker_id;
                                cmd.dest_handle = InterfaceHandle{};
                                mDeliverMessage(cmd);
                                cmd = CMD_IGNORE;
                            } else {
                                cmd = ActionMessage(std::move(tempMessage));
                            }
                        } else {
                            cmd = CMD_IGNORE;
                        }
                    }

                    if (!returnToSender) {
                        if (cmd.action() == CMD_IGNORE) {
                            return;
                        }
                        cmd.setSource(source);
                        cmd.dest_id = parent_broker_id;
                        cmd.dest_handle = InterfaceHandle();
                        mDeliverMessage(cmd);
                    } else {
                        cmd.setDestination(source);
                        cmd.counter = filterCounter;
                        cmd.sequenceID = seqID;
                        cmd.source_handle = FiltI->handle;
                        cmd.source_id = mFedID;
                        if (cmd.action() == CMD_IGNORE) {
                            cmd.setAction(destFilter ? CMD_NULL_DEST_MESSAGE : CMD_NULL_MESSAGE);

                            mDeliverMessage(cmd);
                            return;
                        }
                        cmd.setAction(destFilter ? CMD_DEST_FILTER_RESULT : CMD_FILTER_RESULT);

                        mDeliverMessage(cmd);
                    }
                }
            } else {
                // the filter didn't have a function or was deactivated but still was requested to
                // process
                bool destFilter = (cmd.action() == CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                bool returnToSender =
                    ((cmd.action() == CMD_SEND_FOR_FILTER_AND_RETURN) || destFilter);
                auto source = cmd.getSource();
                if (!returnToSender) {
                    cmd.setAction(CMD_SEND_MESSAGE);
                    cmd.dest_id = parent_broker_id;
                    cmd.dest_handle = InterfaceHandle();
                    mDeliverMessage(cmd);
                } else {
                    cmd.setDestination(source);
                    cmd.setAction(destFilter ? CMD_DEST_FILTER_RESULT : CMD_FILTER_RESULT);

                    cmd.source_handle = FiltI->handle;
                    cmd.source_id = mFedID;
                    mDeliverMessage(cmd);
                }
            }
        } else {
            assert(false);
            // this is an odd condition (not sure what to do yet)
            /*    m.dest_id = filtFunc->sourceOperators[ii].fed_id;
                m.dest_handle = filtFunc->sourceOperators[ii].handle;
                if ((ii < static_cast<int> (filtFunc->sourceOperators.size() - 1)) ||
                    (filtFunc->finalSourceFilter.fed_id != invalid_fed_id))
                {
                    m.setAction(CMD_SEND_FOR_FILTER_OPERATION);
                }
                else
                {
                    m.setAction(CMD_SEND_FOR_FILTER);
                }
                return m;
                */
        }
    }
}